

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_begin_titled(nk_context *ctx,char *name,char *title,nk_rect bounds,nk_flags flags)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  nk_user_font *pnVar7;
  nk_window *pnVar8;
  nk_panel *pnVar9;
  long lVar10;
  nk_hash hash;
  uint uVar11;
  int iVar12;
  nk_page_element *win;
  nk_page_element *ptr;
  nk_window *pnVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  nk_size nVar17;
  bool bVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined8 uVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined8 uVar26;
  float local_48;
  float fStack_44;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4344,
                  "int nk_begin_titled(struct nk_context *, const char *, const char *, struct nk_rect, nk_flags)"
                 );
  }
  if (name == (char *)0x0) {
    __assert_fail("name",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4345,
                  "int nk_begin_titled(struct nk_context *, const char *, const char *, struct nk_rect, nk_flags)"
                 );
  }
  if (title == (char *)0x0) {
    __assert_fail("title",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4346,
                  "int nk_begin_titled(struct nk_context *, const char *, const char *, struct nk_rect, nk_flags)"
                 );
  }
  pnVar7 = (ctx->style).font;
  if ((pnVar7 == (nk_user_font *)0x0) || (pnVar7->width == (nk_text_width_f)0x0)) {
    __assert_fail("ctx->style.font && ctx->style.font->width && \"if this triggers you forgot to add a font\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4347,
                  "int nk_begin_titled(struct nk_context *, const char *, const char *, struct nk_rect, nk_flags)"
                 );
  }
  if (ctx->current != (nk_window *)0x0) {
    __assert_fail("!ctx->current && \"if this triggers you missed a `nk_end` call\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4348,
                  "int nk_begin_titled(struct nk_context *, const char *, const char *, struct nk_rect, nk_flags)"
                 );
  }
  if (*name == '\0') {
    lVar16 = 0;
  }
  else {
    lVar16 = 0;
    do {
      lVar10 = lVar16 + 1;
      lVar16 = lVar16 + 1;
    } while (name[lVar10] != '\0');
  }
  hash = nk_murmur_hash(name,(int)lVar16,0x40);
  win = (nk_page_element *)nk_find_window(ctx,hash,name);
  local_48 = bounds.x;
  fStack_44 = bounds.y;
  if (win == (nk_page_element *)0x0) {
    if (*name == '\0') {
      uVar15 = 0;
    }
    else {
      uVar15 = 0;
      do {
        lVar16 = uVar15 + 1;
        uVar15 = uVar15 + 1;
      } while (name[lVar16] != '\0');
    }
    win = nk_create_page_element(ctx);
    (win->data).tbl.seq = ctx->seq;
    nk_insert_window(ctx,(nk_window *)win,flags >> 8 & NK_INSERT_FRONT);
    (win->data).win.buffer.base = &ctx->memory;
    (win->data).tbl.keys[0x1f] = 1;
    nVar17 = (ctx->memory).allocated;
    (win->data).win.buffer.begin = nVar17;
    (win->data).win.buffer.end = nVar17;
    (win->data).win.buffer.last = nVar17;
    (win->data).win.flags = flags;
    (win->data).tbl.keys[0x12] = (nk_hash)local_48;
    (win->data).tbl.keys[0x13] = (nk_hash)fStack_44;
    (win->data).tbl.keys[0x14] = (nk_hash)bounds.w;
    (win->data).tbl.keys[0x15] = (nk_hash)bounds.h;
    (win->data).tbl.keys[0] = hash;
    nVar17 = 0x3f;
    if ((uint)uVar15 < 0x3f) {
      nVar17 = uVar15 & 0xffffffff;
    }
    nk_memcopy((void *)((long)&win->data + 8),name,nVar17);
    *(undefined1 *)((long)&win->data + nVar17 + 8) = 0;
    (win->data).win.popup.win = (nk_window *)0x0;
    if (ctx->active == (nk_window *)0x0) {
      ctx->active = (nk_window *)win;
    }
  }
  else {
    (win->data).tbl.keys[0x11] = (win->data).tbl.keys[0x11] & 0xfffffc00 | flags;
    if ((flags & 6) == 0) {
      ((nk_rect *)&(win->data).pan.clip.w)->x = local_48;
      (win->data).tbl.keys[0x13] = (nk_hash)fStack_44;
      (win->data).tbl.keys[0x14] = (nk_hash)bounds.w;
      (win->data).tbl.keys[0x15] = (nk_hash)bounds.h;
    }
    if ((win->data).tbl.seq == ctx->seq) {
      __assert_fail("win->seq != ctx->seq",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                    ,0x4373,
                    "int nk_begin_titled(struct nk_context *, const char *, const char *, struct nk_rect, nk_flags)"
                   );
    }
    (win->data).tbl.seq = ctx->seq;
    if (ctx->active == (nk_window *)0x0) {
      ctx->active = (nk_window *)win;
    }
  }
  uVar11 = (win->data).tbl.keys[0x11];
  if ((uVar11 >> 0xc & 1) != 0) {
    ctx->current = (nk_window *)win;
    return 0;
  }
  fVar19 = (ctx->style).window.header.padding.y;
  fVar20 = (ctx->style).window.header.label_padding.y;
  fVar19 = fVar20 + fVar20 + fVar19 + fVar19 + ((ctx->style).font)->height;
  if ((uVar11 >> 0xe & 1) == 0) {
    uVar22 = *(undefined8 *)((long)&win->data + 0x4c);
    fVar20 = (float)uVar22;
    fVar21 = (float)((ulong)uVar22 >> 0x20);
    uVar22 = *(undefined8 *)((long)&win->data + 0x54);
  }
  else {
    uVar22 = *(undefined8 *)((long)&win->data + 0x4c);
    fVar20 = (float)uVar22;
    fVar21 = (float)((ulong)uVar22 >> 0x20);
    uVar22 = CONCAT44(fVar19,(win->data).tbl.keys[0x14]);
  }
  nVar17 = (ctx->memory).allocated;
  (win->data).win.buffer.begin = nVar17;
  (win->data).win.buffer.end = nVar17;
  (win->data).win.buffer.last = nVar17;
  *(nk_rect *)((long)&win->data + 0x70) = nk_null_rect;
  fVar1 = (ctx->input).mouse.buttons[0].clicked_pos.x;
  fVar24 = (float)uVar22 + fVar20;
  fVar23 = (float)((ulong)uVar22 >> 0x20);
  bVar18 = false;
  if ((fVar20 <= fVar1) && (bVar18 = false, fVar1 <= fVar24)) {
    fVar1 = (ctx->input).mouse.buttons[0].clicked_pos.y;
    bVar18 = false;
    if ((fVar21 <= fVar1) && (fVar1 <= fVar23 + fVar21)) {
      if ((ctx->input).mouse.buttons[0].down == 1) {
        bVar18 = (ctx->input).mouse.buttons[0].clicked != 0;
      }
      else {
        bVar18 = false;
      }
    }
  }
  fVar1 = (ctx->input).mouse.pos.x;
  uVar14 = uVar11;
  if ((((fVar1 < fVar20) || (fVar24 < fVar1)) || (fVar2 = (ctx->input).mouse.pos.y, fVar2 < fVar21))
     || (((win == (nk_page_element *)ctx->active || (fVar25 = fVar23 + fVar21, fVar25 < fVar2)) ||
         ((ctx->input).mouse.buttons[0].down != 0)))) {
LAB_00127d6c:
    if (((!bVar18) || (win == (nk_page_element *)ctx->end)) || ((uVar14 & 0x100) != 0))
    goto LAB_00127e96;
    pnVar13 = (win->data).win.next;
    if (pnVar13 != (nk_window *)0x0) {
      do {
        uVar14 = pnVar13->flags;
        if ((uVar14 >> 0xe & 1) == 0) {
          uVar22._0_4_ = (pnVar13->bounds).w;
          uVar22._4_4_ = (pnVar13->bounds).h;
        }
        else {
          uVar22 = CONCAT44(fVar19,(pnVar13->bounds).w);
        }
        uVar3 = (pnVar13->bounds).x;
        uVar5 = (pnVar13->bounds).y;
        if ((((float)uVar3 <= fVar1) && (fVar1 <= (float)uVar22 + (float)uVar3)) &&
           ((uVar14 >> 0xc & 1) == 0)) {
          fVar2 = (ctx->input).mouse.pos.y;
          if (((float)uVar5 <= fVar2) && (fVar2 <= (float)((ulong)uVar22 >> 0x20) + (float)uVar5))
          goto LAB_00127e96;
        }
        pnVar8 = (pnVar13->popup).win;
        if ((((pnVar8 != (nk_window *)0x0) &&
             (((uVar14 >> 0xc & 1) == 0 && ((pnVar13->popup).active != 0)))) &&
            (fVar2 = (pnVar8->bounds).x, fVar2 <= fVar24)) &&
           (((fVar20 <= fVar2 + (pnVar8->bounds).w &&
             (fVar2 = (pnVar8->bounds).y, fVar2 <= fVar23 + fVar21)) &&
            (fVar21 <= fVar2 + (pnVar8->bounds).h)))) goto LAB_00127e96;
        pnVar13 = pnVar13->next;
      } while (pnVar13 != (nk_window *)0x0);
    }
  }
  else {
    pnVar13 = (win->data).win.next;
    if (pnVar13 != (nk_window *)0x0) {
      do {
        uVar14 = pnVar13->flags;
        if ((uVar14 >> 0xe & 1) == 0) {
          uVar26._0_4_ = (pnVar13->bounds).w;
          uVar26._4_4_ = (pnVar13->bounds).h;
        }
        else {
          uVar26 = CONCAT44(fVar19,(pnVar13->bounds).w);
        }
        uVar4 = (pnVar13->bounds).x;
        uVar6 = (pnVar13->bounds).y;
        if (((((float)uVar4 <= fVar24) && (fVar20 <= (float)uVar26 + (float)uVar4)) &&
            (((~uVar14 & 0x1100) != 0 &&
             (((float)uVar6 <= fVar25 && (fVar21 <= (float)((ulong)uVar26 >> 0x20) + (float)uVar6)))
             ))) || ((pnVar8 = (pnVar13->popup).win, pnVar8 != (nk_window *)0x0 &&
                     ((((((uVar14 >> 0xc & 1) == 0 && ((pnVar13->popup).active != 0)) &&
                        (fVar2 = (pnVar8->bounds).x, fVar2 <= (float)uVar22 + fVar20)) &&
                       ((fVar20 <= fVar2 + (pnVar8->bounds).w &&
                        (fVar2 = (pnVar8->bounds).y, fVar2 <= fVar25)))) &&
                      (fVar21 <= fVar2 + (pnVar8->bounds).h)))))) goto LAB_00127d6c;
        pnVar13 = pnVar13->next;
      } while (pnVar13 != (nk_window *)0x0);
    }
  }
  if ((nk_page_element *)ctx->end != win) {
    if ((uVar11 >> 8 & 1) == 0) {
      nk_remove_window(ctx,(nk_window *)win);
      nk_insert_window(ctx,(nk_window *)win,NK_INSERT_BACK);
      uVar11 = (win->data).tbl.keys[0x11];
    }
    uVar11 = uVar11 & 0xfffff7ff;
    (win->data).tbl.keys[0x11] = uVar11;
    ctx->active = (nk_window *)win;
  }
LAB_00127e96:
  if (((nk_page_element *)ctx->end != win) && ((uVar11 & 0x100) == 0)) {
    (win->data).tbl.keys[0x11] = uVar11 | 0x800;
  }
  ptr = nk_create_page_element(ctx);
  nk_zero(ptr,0x1d0);
  (win->data).win.layout = (nk_panel *)ptr;
  ctx->current = (nk_window *)win;
  iVar12 = nk_panel_begin(ctx,title,NK_PANEL_WINDOW);
  pnVar9 = (win->data).win.layout;
  pnVar9->offset_x = (nk_uint *)((long)&win->data + 0x5c);
  pnVar9->offset_y = (nk_uint *)((long)&win->data + 0x60);
  return iVar12;
}

Assistant:

NK_API int
nk_begin_titled(struct nk_context *ctx, const char *name, const char *title,
    struct nk_rect bounds, nk_flags flags)
{
    struct nk_window *win;
    struct nk_style *style;
    nk_hash title_hash;
    int title_len;
    int ret = 0;

    NK_ASSERT(ctx);
    NK_ASSERT(name);
    NK_ASSERT(title);
    NK_ASSERT(ctx->style.font && ctx->style.font->width && "if this triggers you forgot to add a font");
    NK_ASSERT(!ctx->current && "if this triggers you missed a `nk_end` call");
    if (!ctx || ctx->current || !title || !name)
        return 0;

    /* find or create window */
    style = &ctx->style;
    title_len = (int)nk_strlen(name);
    title_hash = nk_murmur_hash(name, (int)title_len, NK_WINDOW_TITLE);
    win = nk_find_window(ctx, title_hash, name);
    if (!win) {
        /* create new window */
        nk_size name_length = (nk_size)nk_strlen(name);
        win = (struct nk_window*)nk_create_window(ctx);
        NK_ASSERT(win);
        if (!win) return 0;

        if (flags & NK_WINDOW_BACKGROUND)
            nk_insert_window(ctx, win, NK_INSERT_FRONT);
        else nk_insert_window(ctx, win, NK_INSERT_BACK);
        nk_command_buffer_init(&win->buffer, &ctx->memory, NK_CLIPPING_ON);

        win->flags = flags;
        win->bounds = bounds;
        win->name = title_hash;
        name_length = NK_MIN(name_length, NK_WINDOW_MAX_NAME-1);
        NK_MEMCPY(win->name_string, name, name_length);
        win->name_string[name_length] = 0;
        win->popup.win = 0;
        if (!ctx->active)
            ctx->active = win;
    } else {
        /* update window */
        win->flags &= ~(nk_flags)(NK_WINDOW_PRIVATE-1);
        win->flags |= flags;
        if (!(win->flags & (NK_WINDOW_MOVABLE | NK_WINDOW_SCALABLE)))
            win->bounds = bounds;
        /* If this assert triggers you either:
         *
         * I.) Have more than one window with the same name or
         * II.) You forgot to actually draw the window.
         *      More specific you did not call `nk_clear` (nk_clear will be
         *      automatically called for you if you are using one of the
         *      provided demo backends). */
        NK_ASSERT(win->seq != ctx->seq);
        win->seq = ctx->seq;
        if (!ctx->active)
            ctx->active = win;
    }
    if (win->flags & NK_WINDOW_HIDDEN) {
        ctx->current = win;
        return 0;
    }

    /* window overlapping */
    if (!(win->flags & NK_WINDOW_HIDDEN))
    {
        int inpanel, ishovered;
        const struct nk_window *iter = win;
        float h = ctx->style.font->height + 2.0f * style->window.header.padding.y +
            (2.0f * style->window.header.label_padding.y);
        struct nk_rect win_bounds = (!(win->flags & NK_WINDOW_MINIMIZED))?
            win->bounds: nk_rect(win->bounds.x, win->bounds.y, win->bounds.w, h);

        /* activate window if hovered and no other window is overlapping this window */
        nk_start(ctx, win);
        inpanel = nk_input_has_mouse_click_down_in_rect(&ctx->input, NK_BUTTON_LEFT, win_bounds, nk_true);
        inpanel = inpanel && ctx->input.mouse.buttons[NK_BUTTON_LEFT].clicked;
        ishovered = nk_input_is_mouse_hovering_rect(&ctx->input, win_bounds);
        if ((win != ctx->active) && ishovered && !ctx->input.mouse.buttons[NK_BUTTON_LEFT].down) {
            iter = win->next;
            while (iter) {
                struct nk_rect iter_bounds = (!(iter->flags & NK_WINDOW_MINIMIZED))?
                    iter->bounds: nk_rect(iter->bounds.x, iter->bounds.y, iter->bounds.w, h);
                if (NK_INTERSECT(win_bounds.x, win_bounds.y, win_bounds.w, win_bounds.h,
                    iter_bounds.x, iter_bounds.y, iter_bounds.w, iter_bounds.h) &&
                    (!(iter->flags & NK_WINDOW_HIDDEN) || !(iter->flags & NK_WINDOW_BACKGROUND)))
                    break;

                if (iter->popup.win && iter->popup.active && !(iter->flags & NK_WINDOW_HIDDEN) &&
                    NK_INTERSECT(win->bounds.x, win_bounds.y, win_bounds.w, win_bounds.h,
                    iter->popup.win->bounds.x, iter->popup.win->bounds.y,
                    iter->popup.win->bounds.w, iter->popup.win->bounds.h))
                    break;
                iter = iter->next;
            }
        }

        /* activate window if clicked */
        if (iter && inpanel && (win != ctx->end) && !(iter->flags & NK_WINDOW_BACKGROUND)) {
            iter = win->next;
            while (iter) {
                /* try to find a panel with higher priority in the same position */
                struct nk_rect iter_bounds = (!(iter->flags & NK_WINDOW_MINIMIZED))?
                iter->bounds: nk_rect(iter->bounds.x, iter->bounds.y, iter->bounds.w, h);
                if (NK_INBOX(ctx->input.mouse.pos.x, ctx->input.mouse.pos.y,
                    iter_bounds.x, iter_bounds.y, iter_bounds.w, iter_bounds.h) &&
                    !(iter->flags & NK_WINDOW_HIDDEN))
                    break;
                if (iter->popup.win && iter->popup.active && !(iter->flags & NK_WINDOW_HIDDEN) &&
                    NK_INTERSECT(win_bounds.x, win_bounds.y, win_bounds.w, win_bounds.h,
                    iter->popup.win->bounds.x, iter->popup.win->bounds.y,
                    iter->popup.win->bounds.w, iter->popup.win->bounds.h))
                    break;
                iter = iter->next;
            }
        }

        if (!iter && ctx->end != win) {
            if (!(win->flags & NK_WINDOW_BACKGROUND)) {
                /* current window is active in that position so transfer to top
                 * at the highest priority in stack */
                nk_remove_window(ctx, win);
                nk_insert_window(ctx, win, NK_INSERT_BACK);
            }
            win->flags &= ~(nk_flags)NK_WINDOW_ROM;
            ctx->active = win;
        }
        if (ctx->end != win && !(win->flags & NK_WINDOW_BACKGROUND))
            win->flags |= NK_WINDOW_ROM;
    }

    win->layout = (struct nk_panel*)nk_create_panel(ctx);
    ctx->current = win;
    ret = nk_panel_begin(ctx, title, NK_PANEL_WINDOW);
    win->layout->offset_x = &win->scrollbar.x;
    win->layout->offset_y = &win->scrollbar.y;
    return ret;
}